

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O2

void lj_dispatch_stitch(jit_State *J,BCIns *pc)

{
  int iVar1;
  lua_State *plVar2;
  undefined8 uVar3;
  TValue *pTVar4;
  BCReg BVar5;
  int *piVar6;
  uint32_t *puVar7;
  
  piVar6 = __errno_location();
  iVar1 = *piVar6;
  plVar2 = J->L;
  puVar7 = (uint32_t *)((ulong)plVar2->cframe & 0xfffffffffffffffc);
  uVar3 = *(undefined8 *)(puVar7 + 6);
  *(BCIns **)(puVar7 + 6) = pc;
  pTVar4 = plVar2->base;
  BVar5 = cur_topslot((GCproto *)(*(long *)((pTVar4[-2].u64 & 0x7fffffffffff) + 0x20) + -0x68),
                      pc + 1,*puVar7);
  plVar2->top = pTVar4 + BVar5;
  lj_trace_stitch(J,pc + -1);
  *(undefined8 *)(puVar7 + 6) = uVar3;
  *piVar6 = iVar1;
  return;
}

Assistant:

void LJ_FASTCALL lj_dispatch_stitch(jit_State *J, const BCIns *pc)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  void *cf = cframe_raw(L->cframe);
  const BCIns *oldpc = cframe_pc(cf);
  setcframe_pc(cf, pc);
  /* Before dispatch, have to bias PC by 1. */
  L->top = L->base + cur_topslot(curr_proto(L), pc+1, cframe_multres_n(cf));
  lj_trace_stitch(J, pc-1);  /* Point to the CALL instruction. */
  setcframe_pc(cf, oldpc);
  ERRNO_RESTORE
}